

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmDereference(ExpressionContext *ctx,VmModule *module,ExprDereference *node)

{
  TypeBase *pTVar1;
  TypeBase *type;
  VmValue *pVVar2;
  uint in_R9D;
  
  pVVar2 = CompileVm(ctx,module,node->value);
  pTVar1 = node->value->type;
  if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x12)) {
    type = (node->super_ExprBase).type;
    if ((TypeBase *)pTVar1[1]._vptr_TypeBase == type) {
      pVVar2 = anon_unknown.dwarf_20a43d::CreateLoad
                         (ctx,module,(node->super_ExprBase).source,type,pVVar2,in_R9D);
      pVVar2 = anon_unknown.dwarf_20a43d::CheckType(ctx,&node->super_ExprBase,pVVar2);
      return pVVar2;
    }
    __assert_fail("refType->subType == node->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbde,
                  "VmValue *CompileVmDereference(ExpressionContext &, VmModule *, ExprDereference *)"
                 );
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xbdd,
                "VmValue *CompileVmDereference(ExpressionContext &, VmModule *, ExprDereference *)")
  ;
}

Assistant:

VmValue* CompileVmDereference(ExpressionContext &ctx, VmModule *module, ExprDereference *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	(void)refType;
	assert(refType);
	assert(refType->subType == node->type);

	return CheckType(ctx, node, CreateLoad(ctx, module, node->source, node->type, value, 0));
}